

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O3

MeshAttributeCornerTable * __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
GetAttributeCornerTable
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this,
          int att_id)

{
  pointer puVar1;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  pointer pAVar6;
  ulong uVar7;
  
  pAVar6 = (this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->attribute_data_).
      super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar6) {
    uVar7 = 0;
    do {
      iVar3 = pAVar6[uVar7].decoder_id;
      if ((-1 < (long)iVar3) &&
         (puVar1 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.attributes_decoders_.
                   super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         iVar3 < (int)((ulong)((long)(this->decoder_->super_MeshDecoder).super_PointCloudDecoder.
                                     attributes_decoders_.
                                     super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3
                      ))) {
        _Var2._M_t.
        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
             puVar1[iVar3]._M_t.
             super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
             ._M_t;
        iVar3 = (**(code **)(*(long *)_Var2._M_t.
                                      super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                      .
                                      super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                      ._M_head_impl + 0x30))
                          (_Var2._M_t.
                           super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                           .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                           _M_head_impl);
        if (0 < iVar3) {
          iVar3 = 0;
          do {
            iVar4 = (**(code **)(*(long *)_Var2._M_t.
                                          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                          .
                                          super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                          ._M_head_impl + 0x28))
                              (_Var2._M_t.
                               super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                               .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                               _M_head_impl,iVar3);
            if (iVar4 == att_id) {
              pAVar6 = (this->attribute_data_).
                       super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (pAVar6[uVar7].is_connectivity_used != false) {
                return &pAVar6[uVar7].connectivity_data;
              }
              return (MeshAttributeCornerTable *)0x0;
            }
            iVar3 = iVar3 + 1;
            iVar4 = (**(code **)(*(long *)_Var2._M_t.
                                          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                          .
                                          super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                          ._M_head_impl + 0x30))
                              (_Var2._M_t.
                               super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                               .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                               _M_head_impl);
          } while (iVar3 < iVar4);
        }
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      pAVar6 = (this->attribute_data_).
               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->attribute_data_).
                     super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6 >> 6) *
              -0x3333333333333333;
    } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
  }
  return (MeshAttributeCornerTable *)0x0;
}

Assistant:

const MeshAttributeCornerTable *
MeshEdgebreakerDecoderImpl<TraversalDecoder>::GetAttributeCornerTable(
    int att_id) const {
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    const int decoder_id = attribute_data_[i].decoder_id;
    if (decoder_id < 0 || decoder_id >= decoder_->num_attributes_decoders()) {
      continue;
    }
    const AttributesDecoderInterface *const dec =
        decoder_->attributes_decoder(decoder_id);
    for (int j = 0; j < dec->GetNumAttributes(); ++j) {
      if (dec->GetAttributeId(j) == att_id) {
        if (attribute_data_[i].is_connectivity_used) {
          return &attribute_data_[i].connectivity_data;
        }
        return nullptr;
      }
    }
  }
  return nullptr;
}